

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,PageSizeId pageSizeId)

{
  PageSizeId PVar1;
  PageSizeId in_EDX;
  undefined4 in_register_00000034;
  QPageSize *pageSize;
  long lVar2;
  QPageSize *pQVar3;
  long in_FS_OFFSET;
  QPageSize aQStack_38 [8];
  long local_30;
  
  pageSize = (QPageSize *)CONCAT44(in_register_00000034,pageSizeId);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pageSize[0x6b] == (QPageSize)0x0) {
    (**(code **)(*(long *)pageSize + 0x130))(pageSize);
  }
  pQVar3 = *(QPageSize **)(pageSize + 0x78);
  lVar2 = *(long *)(pageSize + 0x80) << 3;
  do {
    if (lVar2 == 0) {
      QPageSize::QPageSize(aQStack_38,in_EDX);
      supportedPageSizeMatch(this,pageSize);
      QPageSize::~QPageSize(aQStack_38);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return this;
      }
LAB_0012c0d0:
      __stack_chk_fail();
    }
    PVar1 = QPageSize::id();
    if (PVar1 == in_EDX) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QPageSize::QPageSize((QPageSize *)this,pQVar3);
        return this;
      }
      goto LAB_0012c0d0;
    }
    pQVar3 = pQVar3 + 8;
    lVar2 = lVar2 + -8;
  } while( true );
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(QPageSize::PageSizeId pageSizeId) const
{
    if (!m_havePageSizes)
        loadPageSizes();

    for (const QPageSize &ps : std::as_const(m_pageSizes)) {
        if (ps.id() == pageSizeId)
            return ps;
    }

    // If no supported page size found, try use a custom size instead if supported
    return supportedPageSizeMatch(QPageSize(pageSizeId));
}